

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse::InternalSwap
          (CodeGeneratorResponse *this,CodeGeneratorResponse *other)

{
  uint32_t uVar1;
  intptr_t iVar2;
  void *pvVar3;
  uint64_t uVar4;
  long __tmp;
  
  iVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ =
       (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  (other->super_Message).super_MessageLite._internal_metadata_.ptr_ = iVar2;
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::InternalSwap
            (&this->file_,&other->file_);
  pvVar3 = (other->error_).tagged_ptr_.ptr_;
  (other->error_).tagged_ptr_.ptr_ = (this->error_).tagged_ptr_.ptr_;
  (this->error_).tagged_ptr_.ptr_ = pvVar3;
  uVar4 = this->supported_features_;
  this->supported_features_ = other->supported_features_;
  other->supported_features_ = uVar4;
  return;
}

Assistant:

void CodeGeneratorResponse::InternalSwap(CodeGeneratorResponse* other) {
  using std::swap;
  auto* lhs_arena = GetArenaForAllocation();
  auto* rhs_arena = other->GetArenaForAllocation();
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  file_.InternalSwap(&other->file_);
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &error_, lhs_arena,
      &other->error_, rhs_arena
  );
  swap(supported_features_, other->supported_features_);
}